

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O2

GLuint __thiscall
glcts::anon_unknown_0::SACSubcaseBase::CreateProgram
          (SACSubcaseBase *this,char *src_vs,char *src_fs,bool link)

{
  CallLogWrapper *this_00;
  GLuint program;
  GLuint GVar1;
  char *src_fs_local;
  char *src_vs_local;
  
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  src_fs_local = src_fs;
  src_vs_local = src_vs;
  program = glu::CallLogWrapper::glCreateProgram(this_00);
  if (src_vs != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&src_vs_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  }
  if (src_fs != (char *)0x0) {
    GVar1 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
    glu::CallLogWrapper::glAttachShader(this_00,program,GVar1);
    glu::CallLogWrapper::glDeleteShader(this_00,GVar1);
    glu::CallLogWrapper::glShaderSource(this_00,GVar1,1,&src_fs_local,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(this_00,GVar1);
  }
  if (link) {
    LinkProgram(this,program);
  }
  return program;
}

Assistant:

GLuint CreateProgram(const char* src_vs, const char* src_fs, bool link)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			glCompileShader(sh);
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			glCompileShader(sh);
		}
		if (link)
		{
			LinkProgram(p);
		}
		return p;
	}